

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O2

double getStepLength(Mesh *mesh,VectorXd *params,VectorXd *p,VectorXd *grad,double *epsilon,
                    double alpha0)

{
  bool bVar1;
  ostream *poVar2;
  VectorXd *pVVar3;
  double local_a8;
  void *local_a0 [2];
  VectorXd *local_90;
  double local_88;
  double local_80;
  double local_78;
  VectorXd *local_70 [2];
  Index local_60;
  double local_50;
  VectorXd *local_48;
  
  local_78 = getEnergy(mesh,params,*epsilon,false);
  local_60 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_90 = params;
  local_70[0] = params;
  local_50 = alpha0;
  local_48 = p;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_a0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)local_70);
  local_80 = getEnergy(mesh,(VectorXd *)local_a0,*epsilon,false);
  free(local_a0[0]);
  local_88 = Eigen::internal::
             dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>
             ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)p,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)grad);
  pVVar3 = local_90;
  local_a8 = alpha0;
  do {
    if (local_80 <= local_a8 * 0.0001 * local_88 + local_78) {
      local_60 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows;
      local_50 = local_a8;
      local_70[0] = pVVar3;
      local_48 = p;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_a0,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)local_70);
      bVar1 = checkCreterion(mesh,(VectorXd *)local_a0,*epsilon);
      free(local_a0[0]);
      pVVar3 = local_90;
      if (bVar1) {
        std::operator<<((ostream *)std::cout,"Step len: ");
        poVar2 = std::ostream::_M_insert<double>(local_a8);
        std::operator<<(poVar2," dphi: ");
        poVar2 = std::ostream::_M_insert<double>(local_88);
        std::endl<char,std::char_traits<char>>(poVar2);
        return local_a8;
      }
    }
    local_a8 = local_a8 * 0.5;
    local_60 = (p->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    local_70[0] = pVVar3;
    local_50 = local_a8;
    local_48 = p;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_a0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)local_70);
    local_80 = getEnergy(mesh,(VectorXd *)local_a0,*epsilon,false);
    free(local_a0[0]);
  } while( true );
}

Assistant:

double getStepLength(const Mesh& mesh, const Eigen::VectorXd& params, const Eigen::VectorXd& p, const Eigen::VectorXd& grad, const double& epsilon, double alpha0) {
    constexpr double c1 = 1e-4;
    double ene0 = getEnergy(mesh, params, epsilon);
    double enei = getEnergy(mesh, params + alpha0 * p, epsilon);
    double dphi = p.dot(grad);
    while (enei > ene0 + c1 * alpha0 * dphi || !checkCreterion(mesh, params + alpha0 * p, epsilon)) {
        alpha0 *= 0.50;
        enei = getEnergy(mesh, params + alpha0 * p, epsilon);
    }

#ifdef TEST
    std::cout << "Step len: " << alpha0 << " dphi: " << dphi << std::endl;
#endif
    return alpha0;
}